

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

bool __thiscall
QGraphicsAnchorLayoutPrivate::simplifyGraphIteration
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation,bool *feasible)

{
  AnchorVertex *pAVar1;
  bool bVar2;
  QGraphicsLayoutItem *pQVar3;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> *pQVar4;
  AnchorVertex **ppAVar5;
  qsizetype qVar6;
  AnchorData *pAVar7;
  QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *this_00;
  const_reference ppAVar8;
  undefined1 *in_RDX;
  undefined4 in_ESI;
  QGraphicsAnchorLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  AnchorData *newAnchor;
  AnchorData *sequence;
  AnchorData *lastAnchor;
  AnchorData *firstAnchor;
  int i;
  bool cycleFound;
  AnchorData *data;
  bool endOfSequence;
  AnchorVertex *afterSequence;
  bool isLayoutVertex;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> *adjacents;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *g;
  QGraphicsAnchorLayout *q;
  bool newFeasible;
  AnchorVertex *next;
  AnchorVertex *after;
  AnchorVertex *v;
  AnchorVertex *beforeSequence;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> pair;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> candidates;
  QStack<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
  stack;
  QSet<QtGraphicsAnchorLayout::AnchorVertex_*> visited;
  undefined4 in_stack_fffffffffffffe48;
  Orientation in_stack_fffffffffffffe4c;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> *in_stack_fffffffffffffe50;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> *in_stack_fffffffffffffe58;
  AnchorVertex *in_stack_fffffffffffffe60;
  bool local_189;
  AnchorVertex *local_188;
  AnchorVertex *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 uVar9;
  AnchorData *in_stack_fffffffffffffea8;
  AnchorData *in_stack_fffffffffffffeb0;
  Orientation local_134;
  int local_130;
  bool local_119;
  undefined4 in_stack_ffffffffffffff18;
  QGraphicsAnchorLayoutPrivate *newAnchor_00;
  undefined6 in_stack_ffffffffffffff28;
  byte in_stack_ffffffffffffff2e;
  byte bVar10;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> local_c0;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> local_b0;
  AnchorVertex *local_a0;
  AnchorVertex *local_98;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> local_90;
  AnchorVertex *local_78;
  AnchorVertex *local_70;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> local_68;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> local_58;
  AnchorVertex *local_40;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> local_38;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  newAnchor_00 = in_RDI;
  pQVar3 = (QGraphicsLayoutItem *)q_func(in_RDI);
  pQVar4 = (QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)
           QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
           ::operator[]((QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
                         *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::QSet
            ((QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93b4db);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QStack<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
  ::QStack((QStack<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
            *)0x93b515);
  local_40 = (AnchorVertex *)0x0;
  ppAVar5 = QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                      ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                       in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>::
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*&,_true>
            (&local_38,&local_40,ppAVar5);
  QStack<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
  ::push((QStack<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
          *)in_stack_fffffffffffffe50,
         (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*> *)
         CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (AnchorVertex **)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*>::QList
            ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93b5a0);
  do {
    bVar2 = QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
            ::isEmpty((QList<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                       *)0x93b5ad);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      in_stack_ffffffffffffff2e = 0;
      break;
    }
    local_68.second = (AnchorVertex *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.first = (AnchorVertex *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = QStack<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
               ::pop((QStack<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                      *)0x93b5e3);
    local_70 = local_68.first;
    local_78 = local_68.second;
    Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
    adjacentVertices((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                      *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe88);
    uVar9 = true;
    if (local_78->m_item != pQVar3) {
      qVar6 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::size(&local_90);
      uVar9 = qVar6 != 2;
    }
    local_119 = (bool)uVar9;
    if ((bool)uVar9 == false) {
      local_98 = (AnchorVertex *)&DAT_aaaaaaaaaaaaaaaa;
      bVar2 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::isEmpty
                        ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93b6ec);
      pAVar1 = local_70;
      if (bVar2) {
        ppAVar5 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::last
                            ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        if (pAVar1 == *ppAVar5) {
          ppAVar5 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::first(in_stack_fffffffffffffe50);
          in_stack_fffffffffffffe88 = *ppAVar5;
          local_98 = in_stack_fffffffffffffe88;
        }
        else {
          ppAVar5 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::last
                              ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          in_stack_fffffffffffffe88 = *ppAVar5;
          local_98 = in_stack_fffffffffffffe88;
        }
      }
      else {
        ppAVar5 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::constLast
                            ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        pAVar1 = *ppAVar5;
        ppAVar5 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::last
                            ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        if (pAVar1 == *ppAVar5) {
          ppAVar5 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::first(in_stack_fffffffffffffe50);
          local_188 = *ppAVar5;
        }
        else {
          ppAVar5 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::last
                              ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
          local_188 = *ppAVar5;
        }
        local_98 = local_188;
      }
      pAVar7 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
               edgeData((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                         *)in_stack_fffffffffffffe50,(AnchorVertex *)in_stack_fffffffffffffea8,
                        (AnchorVertex *)in_RDI);
      bVar2 = QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::contains
                        ((QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)in_stack_fffffffffffffe50,
                         (AnchorVertex **)
                         CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      local_189 = true;
      if (!bVar2) {
        local_189 = ((byte)pAVar7->field_0x78 >> 3 & 1) != 0;
      }
      local_119 = local_189;
      if (local_189 == false) {
        QList<QtGraphicsAnchorLayout::AnchorVertex_*>::append
                  ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93b858,
                   (parameter_type)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      }
      else if ((bVar2) && (local_70 != local_98)) {
        QList<QtGraphicsAnchorLayout::AnchorVertex_*>::append
                  ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93b89b,
                   (parameter_type)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      }
    }
    local_130 = 0;
    while( true ) {
      this_00 = (QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)(long)local_130;
      qVar6 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::size(&local_90);
      if (qVar6 <= (long)this_00) break;
      ppAVar8 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::at
                          (in_stack_fffffffffffffe50,
                           CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      local_a0 = *ppAVar8;
      bVar2 = QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::contains
                        ((QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)in_stack_fffffffffffffe50,
                         (AnchorVertex **)
                         CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      if (!bVar2) {
        if (local_119 == false) {
          std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
          ::
          pair<QtGraphicsAnchorLayout::AnchorVertex_*&,_QtGraphicsAnchorLayout::AnchorVertex_*&,_true>
                    (&local_c0,&local_70,&local_a0);
          QStack<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
          ::push((QStack<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                  *)in_stack_fffffffffffffe50,
                 (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
                  *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        }
        else {
          std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
          ::
          pair<QtGraphicsAnchorLayout::AnchorVertex_*&,_QtGraphicsAnchorLayout::AnchorVertex_*&,_true>
                    (&local_b0,&local_78,&local_a0);
          QStack<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
          ::push((QStack<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
                  *)in_stack_fffffffffffffe50,
                 (pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>
                  *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        }
      }
      local_130 = local_130 + 1;
    }
    QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::insert
              (this_00,(AnchorVertex **)in_stack_fffffffffffffe60);
    if ((local_119 == false) ||
       (bVar2 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::isEmpty
                          ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93b9ce), bVar2)) {
      local_134 = Vertical;
    }
    else {
      in_stack_fffffffffffffe58 = pQVar4;
      in_stack_fffffffffffffe60 = local_70;
      QList<QtGraphicsAnchorLayout::AnchorVertex_*>::constFirst(in_stack_fffffffffffffe50);
      pAVar7 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
               edgeData((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                         *)in_stack_fffffffffffffe50,(AnchorVertex *)in_stack_fffffffffffffea8,
                        (AnchorVertex *)in_RDI);
      if (((byte)pAVar7->field_0x78 >> 3 & 1) != 0) {
        ppAVar5 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::constFirst
                            (in_stack_fffffffffffffe50);
        local_70 = *ppAVar5;
        QList<QtGraphicsAnchorLayout::AnchorVertex_*>::remove(&local_58,(char *)0x0);
        bVar2 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::isEmpty
                          ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93ba72);
        if (bVar2) {
          local_134 = Vertical;
          goto LAB_0093bbe7;
        }
      }
      in_stack_fffffffffffffe50 = pQVar4;
      QList<QtGraphicsAnchorLayout::AnchorVertex_*>::constLast
                ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      pAVar7 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
               edgeData((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                         *)in_stack_fffffffffffffe50,(AnchorVertex *)in_stack_fffffffffffffea8,
                        (AnchorVertex *)in_RDI);
      if (((byte)pAVar7->field_0x78 >> 3 & 1) != 0) {
        QList<QtGraphicsAnchorLayout::AnchorVertex_*>::constLast
                  ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                   CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        qVar6 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::size(&local_58);
        QList<QtGraphicsAnchorLayout::AnchorVertex_*>::remove(&local_58,(char *)(qVar6 + -1));
        bVar2 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::isEmpty
                          ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93bb1e);
        if (bVar2) {
          local_134 = Vertical;
          goto LAB_0093bbe7;
        }
      }
      in_stack_fffffffffffffeb0 =
           createSequence((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                           *)in_stack_fffffffffffffeb0,(AnchorVertex *)in_stack_fffffffffffffea8,
                          (QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)in_RDI,
                          (AnchorVertex *)CONCAT17(uVar9,in_stack_fffffffffffffe98));
      bVar10 = 0;
      in_stack_fffffffffffffea8 =
           addAnchorMaybeParallel
                     ((QGraphicsAnchorLayoutPrivate *)
                      CONCAT17(0xaa,CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)),
                      (AnchorData *)newAnchor_00,(bool *)CONCAT44(in_ESI,in_stack_ffffffffffffff18))
      ;
      if ((bVar10 & 1) == 0) {
        *in_RDX = 0;
        in_stack_ffffffffffffff2e = 0;
        local_134 = Horizontal;
      }
      else if (in_stack_fffffffffffffea8 == in_stack_fffffffffffffeb0) {
        QList<QtGraphicsAnchorLayout::AnchorVertex_*>::clear(in_stack_fffffffffffffe50);
        local_134 = 0;
      }
      else {
        in_stack_ffffffffffffff2e = 1;
        local_134 = Horizontal;
      }
    }
LAB_0093bbe7:
    QList<QtGraphicsAnchorLayout::AnchorVertex_*>::~QList
              ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93bbf4);
    in_stack_fffffffffffffe4c = local_134;
  } while ((local_134 == 0) || (local_134 == Vertical));
  QList<QtGraphicsAnchorLayout::AnchorVertex_*>::~QList
            ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93bc39);
  QStack<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
  ::~QStack((QStack<std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorVertex_*>_>
             *)0x93bc46);
  QSet<QtGraphicsAnchorLayout::AnchorVertex_*>::~QSet
            ((QSet<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93bc53);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(in_stack_ffffffffffffff2e & 1);
}

Assistant:

bool QGraphicsAnchorLayoutPrivate::simplifyGraphIteration(Qt::Orientation orientation,
                                                          bool *feasible)
{
    Q_Q(QGraphicsAnchorLayout);
    Graph<AnchorVertex, AnchorData> &g = graph[orientation];

    QSet<AnchorVertex *> visited;
    QStack<std::pair<AnchorVertex *, AnchorVertex *> > stack;
    stack.push(std::pair(static_cast<AnchorVertex *>(nullptr), layoutFirstVertex[orientation]));
    QList<AnchorVertex *> candidates;

    // Walk depth-first, in the stack we store start of the candidate sequence (beforeSequence)
    // and the vertex to be visited.
    while (!stack.isEmpty()) {
        std::pair<AnchorVertex *, AnchorVertex *> pair = stack.pop();
        AnchorVertex *beforeSequence = pair.first;
        AnchorVertex *v = pair.second;

        // The basic idea is to determine whether we found an end of sequence,
        // if that's the case, we stop adding vertices to the candidate list
        // and do a simplification step.
        //
        // A vertex can trigger an end of sequence if
        // (a) it is a layout vertex, we don't simplify away the layout vertices;
        // (b) it does not have exactly 2 adjacents;
        // (c) its next adjacent is already visited (a cycle in the graph).
        // (d) the next anchor is a center anchor.

        const QList<AnchorVertex *> &adjacents = g.adjacentVertices(v);
        const bool isLayoutVertex = v->m_item == q;
        AnchorVertex *afterSequence = v;
        bool endOfSequence = false;

        //
        // Identify the end cases.
        //

        // Identifies cases (a) and (b)
        endOfSequence = isLayoutVertex || adjacents.size() != 2;

        if (!endOfSequence) {
            // This is a tricky part. We peek at the next vertex to find out whether
            //
            // - we already visited the next vertex (c);
            // - the next anchor is a center (d).
            //
            // Those are needed to identify the remaining end of sequence cases. Note that unlike
            // (a) and (b), we preempt the end of sequence by looking into the next vertex.

            // Peek at the next vertex
            AnchorVertex *after;
            if (candidates.isEmpty())
                after = (beforeSequence == adjacents.last() ? adjacents.first() : adjacents.last());
            else
                after = (candidates.constLast() == adjacents.last() ? adjacents.first() : adjacents.last());

            // ### At this point we assumed that candidates will not contain 'after', this may not hold
            // when simplifying FLOATing anchors.
            Q_ASSERT(!candidates.contains(after));

            const AnchorData *data = g.edgeData(v, after);
            Q_ASSERT(data);
            const bool cycleFound = visited.contains(after);

            // Now cases (c) and (d)...
            endOfSequence = cycleFound || data->isCenterAnchor;

            if (!endOfSequence) {
                // If it's not an end of sequence, then the vertex didn't trigger neither of the
                // previously three cases, so it can be added to the candidates list.
                candidates.append(v);
            } else if (cycleFound && (beforeSequence != after)) {
                afterSequence = after;
                candidates.append(v);
            }
        }

        //
        // Add next non-visited vertices to the stack.
        //
        for (int i = 0; i < adjacents.size(); ++i) {
            AnchorVertex *next = adjacents.at(i);
            if (visited.contains(next))
                continue;

            // If current vertex is an end of sequence, and it'll reset the candidates list. So
            // the next vertices will build candidates lists with the current vertex as 'before'
            // vertex. If it's not an end of sequence, we keep the original 'before' vertex,
            // since we are keeping the candidates list.
            if (endOfSequence)
                stack.push(std::pair(v, next));
            else
                stack.push(std::pair(beforeSequence, next));
        }

        visited.insert(v);

        if (!endOfSequence || candidates.isEmpty())
            continue;

        //
        // Create a sequence for (beforeSequence, candidates, afterSequence).
        //

        // One restriction we have is to not simplify half of an anchor and let the other half
        // unsimplified. So we remove center edges before and after the sequence.
        const AnchorData *firstAnchor = g.edgeData(beforeSequence, candidates.constFirst());
        if (firstAnchor->isCenterAnchor) {
            beforeSequence = candidates.constFirst();
            candidates.remove(0);

            // If there's not candidates to be simplified, leave.
            if (candidates.isEmpty())
                continue;
        }

        const AnchorData *lastAnchor = g.edgeData(candidates.constLast(), afterSequence);
        if (lastAnchor->isCenterAnchor) {
            afterSequence = candidates.constLast();
            candidates.remove(candidates.size() - 1);

            if (candidates.isEmpty())
                continue;
        }

        //
        // Add the sequence to the graph.
        //

        AnchorData *sequence = createSequence(&g, beforeSequence, candidates, afterSequence);

        // If 'beforeSequence' and 'afterSequence' already had an anchor between them, we'll
        // create a parallel anchor between the new sequence and the old anchor.
        bool newFeasible;
        AnchorData *newAnchor = addAnchorMaybeParallel(sequence, &newFeasible);

        if (!newFeasible) {
            *feasible = false;
            return false;
        }

        // When a new parallel anchor is create in the graph, we finish the iteration and return
        // true to indicate a new iteration is needed. This happens because a parallel anchor
        // changes the number of adjacents one vertex has, possibly opening up oportunities for
        // building candidate lists (when adjacents == 2).
        if (newAnchor != sequence)
            return true;

        // If there was no parallel simplification, we'll keep walking the graph. So we clear the
        // candidates list to start again.
        candidates.clear();
    }

    return false;
}